

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MatchingTest_MatchesAppearInPostTraversalOrderForMovedFields_Test
::TestBody(MatchingTest_MatchesAppearInPostTraversalOrderForMovedFields_Test *this)

{
  RepeatedPtrField<proto2_unittest::TestDiffMessage_Item> *this_00;
  RepeatedPtrField<proto2_unittest::TestDiffMessage_Item> *this_01;
  Descriptor *pDVar1;
  FieldDescriptor *this_02;
  FieldDescriptor *this_03;
  FieldDescriptor *field;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>_>
  *pVVar2;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>_> *pVVar3;
  char *message;
  undefined1 in_R9B;
  RepeatedPtrField<proto2_unittest::TestField> *pRVar4;
  RepeatedField<int> *pRVar5;
  string_view name;
  string_view name_00;
  string_view name_01;
  AssertHelper AStack_378;
  AssertionResult gtest_ar;
  string local_360;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencer differencer;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg1);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg2);
  pDVar1 = proto2_unittest::TestDiffMessage::GetDescriptor();
  name._M_str = "item";
  name._M_len = 4;
  this_02 = Descriptor::FindFieldByName(pDVar1,name);
  pDVar1 = FieldDescriptor::message_type(this_02);
  name_00._M_str = "rm";
  name_00._M_len = 2;
  this_03 = Descriptor::FindFieldByName(pDVar1,name_00);
  pDVar1 = FieldDescriptor::message_type(this_03);
  name_01._M_str = "rc";
  name_01._M_len = 2;
  field = Descriptor::FindFieldByName(pDVar1,name_01);
  util::MessageDifferencer::MessageDifferencer(&differencer);
  util::MessageDifferencer::TreatAsSet(&differencer,this_02);
  util::MessageDifferencer::TreatAsSet(&differencer,this_03);
  util::MessageDifferencer::TreatAsSet(&differencer,field);
  this_01 = &msg1.field_0._impl_.item_;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_01->super_RepeatedPtrFieldBase);
  pRVar4 = &(pVVar2->field_0)._impl_.rm_;
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar4->super_RepeatedPtrFieldBase);
  (pVVar3->field_0)._impl_.c_ = 1;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 2;
  pRVar5 = &(pVVar3->field_0)._impl_.rc_;
  RepeatedField<int>::Add(pRVar5,2);
  RepeatedField<int>::Add(pRVar5,3);
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar4->super_RepeatedPtrFieldBase);
  (pVVar3->field_0)._impl_.c_ = 4;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 2;
  pRVar5 = &(pVVar3->field_0)._impl_.rc_;
  RepeatedField<int>::Add(pRVar5,5);
  RepeatedField<int>::Add(pRVar5,6);
  RepeatedField<int>::Add(pRVar5,7);
  this_00 = &msg2.field_0._impl_.item_;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_00->super_RepeatedPtrFieldBase);
  pRVar4 = &(pVVar2->field_0)._impl_.rm_;
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar4->super_RepeatedPtrFieldBase);
  (pVVar3->field_0)._impl_.c_ = 4;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 2;
  pRVar5 = &(pVVar3->field_0)._impl_.rc_;
  RepeatedField<int>::Add(pRVar5,7);
  RepeatedField<int>::Add(pRVar5,6);
  RepeatedField<int>::Add(pRVar5,5);
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar4->super_RepeatedPtrFieldBase);
  (pVVar3->field_0)._impl_.c_ = 1;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 2;
  pRVar5 = &(pVVar3->field_0)._impl_.rc_;
  RepeatedField<int>::Add(pRVar5,3);
  RepeatedField<int>::Add(pRVar5,2);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_01->super_RepeatedPtrFieldBase);
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&(pVVar2->field_0)._impl_.rm_.super_RepeatedPtrFieldBase);
  (pVVar3->field_0)._impl_.c_ = 8;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 2;
  pRVar5 = &(pVVar3->field_0)._impl_.rc_;
  RepeatedField<int>::Add(pRVar5,10);
  RepeatedField<int>::Add(pRVar5,0xb);
  RepeatedField<int>::Add(pRVar5,9);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_00->super_RepeatedPtrFieldBase);
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&(pVVar2->field_0)._impl_.rm_.super_RepeatedPtrFieldBase);
  (pVVar3->field_0)._impl_.c_ = 8;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 2;
  pRVar5 = &(pVVar3->field_0)._impl_.rc_;
  RepeatedField<int>::Add(pRVar5,9);
  RepeatedField<int>::Add(pRVar5,10);
  RepeatedField<int>::Add(pRVar5,0xb);
  protobuf::(anonymous_namespace)::MatchingTest::RunWithResult_abi_cxx11_
            (&local_360,&differencer,(MessageDifferencer *)&msg1,&msg2.super_Message,(Message *)0x1,
             (bool)in_R9B);
  testing::internal::CmpHelperEQ<char[876],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"matched: item[0].rm[0].c -> item[0].rm[1].c : 1\\n\" \"moved: item[0].rm[0].rc[0] -> item[0].rm[1].rc[1] : 2\\n\" \"moved: item[0].rm[0].rc[1] -> item[0].rm[1].rc[0] : 3\\n\" \"moved: item[0].rm[0] -> item[0].rm[1] : { c: 1 rc: 2 rc: 3 }\\n\" \"matched: item[0].rm[1].c -> item[0].rm[0].c : 4\\n\" \"moved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 5\\n\" \"matched: item[0].rm[1].rc[1] -> item[0].rm[0].rc[1] : 6\\n\" \"moved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 7\\n\" \"moved: item[0].rm[1] -> item[0].rm[0] : { c: 4 rc: 5 rc: 6 rc: 7 }\\n\" \"matched: item[0] : { rm { c: 1 rc: 2 rc: 3 }\" \" rm { c: 4 rc: 5 rc: 6 rc: 7 } }\\n\" \"matched: item[1].rm[0].c : 8\\n\" \"moved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 10\\n\" \"moved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[2] : 11\\n\" \"moved: item[1].rm[0].rc[2] -> item[1].rm[0].rc[0] : 9\\n\" \"matched: item[1].rm[0] : { c: 8 rc: 10 rc: 11 rc: 9 }\\n\" \"matched: item[1] : { rm { c: 8 rc: 10 rc: 11 rc: 9 } }\\n\""
             ,"RunWithResult(&differencer, msg1, msg2, true)",
             (char (*) [876])
             "matched: item[0].rm[0].c -> item[0].rm[1].c : 1\nmoved: item[0].rm[0].rc[0] -> item[0].rm[1].rc[1] : 2\nmoved: item[0].rm[0].rc[1] -> item[0].rm[1].rc[0] : 3\nmoved: item[0].rm[0] -> item[0].rm[1] : { c: 1 rc: 2 rc: 3 }\nmatched: item[0].rm[1].c -> item[0].rm[0].c : 4\nmoved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 5\nmatched: item[0].rm[1].rc[1] -> item[0].rm[0].rc[1] : 6\nmoved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 7\nmoved: item[0].rm[1] -> item[0].rm[0] : { c: 4 rc: 5 rc: 6 rc: 7 }\nmatched: item[0] : { rm { c: 1 rc: 2 rc: 3 } rm { c: 4 rc: 5 rc: 6 rc: 7 } }\nmatched: item[1].rm[0].c : 8\nmoved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 10\nmoved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[2] : 11\nmoved: item[1].rm[0].rc[2] -> item[1].rm[0].rc[0] : 9\nmatched: item[1].rm[0] : { c: 8 rc: 10 rc: 11 rc: 9 }\nmatched: item[1] : { rm { c: 8 rc: 10 rc: 11 rc: 9 } }\n"
             ,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_360);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1021,message);
    testing::internal::AssertHelper::operator=(&AStack_378,(Message *)&local_360);
    testing::internal::AssertHelper::~AssertHelper(&AStack_378);
    if ((long *)local_360._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_360._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg2);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg1);
  return;
}

Assistant:

TEST_F(MatchingTest, MatchesAppearInPostTraversalOrderForMovedFields) {
  proto2_unittest::TestDiffMessage msg1, msg2;
  proto2_unittest::TestDiffMessage::Item* item;
  proto2_unittest::TestField* field;

  const FieldDescriptor* desc;
  const FieldDescriptor* nested_desc;
  const FieldDescriptor* double_nested_desc;
  desc = msg1.GetDescriptor()->FindFieldByName("item");
  nested_desc = desc->message_type()->FindFieldByName("rm");
  double_nested_desc = nested_desc->message_type()->FindFieldByName("rc");
  MessageDifferencer differencer;
  differencer.TreatAsSet(desc);
  differencer.TreatAsSet(nested_desc);
  differencer.TreatAsSet(double_nested_desc);

  item = msg1.add_item();
  field = item->add_rm();
  field->set_c(1);
  field->add_rc(2);
  field->add_rc(3);
  field = item->add_rm();
  field->set_c(4);
  field->add_rc(5);
  field->add_rc(6);
  field->add_rc(7);
  item = msg2.add_item();
  field = item->add_rm();
  field->set_c(4);
  field->add_rc(7);
  field->add_rc(6);
  field->add_rc(5);
  field = item->add_rm();
  field->set_c(1);
  field->add_rc(3);
  field->add_rc(2);
  item = msg1.add_item();
  field = item->add_rm();
  field->set_c(8);
  field->add_rc(10);
  field->add_rc(11);
  field->add_rc(9);
  item = msg2.add_item();
  field = item->add_rm();
  field->set_c(8);
  field->add_rc(9);
  field->add_rc(10);
  field->add_rc(11);

  EXPECT_EQ(
      "matched: item[0].rm[0].c -> item[0].rm[1].c : 1\n"
      "moved: item[0].rm[0].rc[0] -> item[0].rm[1].rc[1] : 2\n"
      "moved: item[0].rm[0].rc[1] -> item[0].rm[1].rc[0] : 3\n"
      "moved: item[0].rm[0] -> item[0].rm[1] : { c: 1 rc: 2 rc: 3 }\n"
      "matched: item[0].rm[1].c -> item[0].rm[0].c : 4\n"
      "moved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 5\n"
      "matched: item[0].rm[1].rc[1] -> item[0].rm[0].rc[1] : 6\n"
      "moved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 7\n"
      "moved: item[0].rm[1] -> item[0].rm[0] : { c: 4 rc: 5 rc: 6 rc: 7 }\n"
      "matched: item[0] : { rm { c: 1 rc: 2 rc: 3 }"
      " rm { c: 4 rc: 5 rc: 6 rc: 7 } }\n"
      "matched: item[1].rm[0].c : 8\n"
      "moved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 10\n"
      "moved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[2] : 11\n"
      "moved: item[1].rm[0].rc[2] -> item[1].rm[0].rc[0] : 9\n"
      "matched: item[1].rm[0] : { c: 8 rc: 10 rc: 11 rc: 9 }\n"
      "matched: item[1] : { rm { c: 8 rc: 10 rc: 11 rc: 9 } }\n",
      RunWithResult(&differencer, msg1, msg2, true));
}